

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

int color_tree_get(ColorTree *tree,uchar r,uchar g,uchar b,uchar a)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined3 in_register_00000009;
  undefined3 in_register_00000011;
  undefined3 in_register_00000031;
  undefined3 in_register_00000081;
  uint uVar5;
  
  uVar5 = 0;
  do {
    if (uVar5 == 8) {
      if (tree == (ColorTree *)0x0) {
        return -1;
      }
      return tree->index;
    }
    uVar1 = uVar5 & 0x1f;
    uVar2 = uVar5 & 0x1f;
    uVar3 = uVar5 & 0x1f;
    uVar4 = uVar5 & 0x1f;
    uVar5 = uVar5 + 1;
    tree = tree->children
           [(CONCAT31(in_register_00000081,a) >> uVar2 & 1) +
            (CONCAT31(in_register_00000011,g) >> uVar1 & 1) * 4 +
            (CONCAT31(in_register_00000031,r) >> uVar3 & 1) * 8 +
            (CONCAT31(in_register_00000009,b) >> uVar4 & 1) * 2];
  } while (tree != (ColorTree *)0x0);
  return -1;
}

Assistant:

static int color_tree_get(ColorTree* tree, unsigned char r, unsigned char g, unsigned char b, unsigned char a)
{
  int bit = 0;
  for(bit = 0; bit < 8; ++bit)
  {
    int i = 8 * ((r >> bit) & 1) + 4 * ((g >> bit) & 1) + 2 * ((b >> bit) & 1) + 1 * ((a >> bit) & 1);
    if(!tree->children[i]) return -1;
    else tree = tree->children[i];
  }
  return tree ? tree->index : -1;
}